

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O1

void __thiscall
Assimp::AssbinExport::WriteBinaryCamera(AssbinExport *this,IOStream *container,aiCamera *cam)

{
  uint uVar1;
  AssbinChunkWriter chunk;
  AssbinChunkWriter local_48;
  
  local_48.super_IOStream._vptr_IOStream = (_func_int **)&PTR__AssbinChunkWriter_0082be60;
  local_48.buffer = (uint8_t *)0x0;
  local_48.magic = 0x1234;
  local_48.cur_size = 0;
  local_48.cursor = 0;
  local_48.initial = 0x1000;
  uVar1 = (cam->mName).length;
  local_48.container = container;
  AssbinChunkWriter::Grow(&local_48,4);
  *(ai_uint32 *)(local_48.buffer + local_48.cursor) = (cam->mName).length;
  local_48.cursor = local_48.cursor + 4;
  (*local_48.super_IOStream._vptr_IOStream[3])(&local_48,(cam->mName).data,(ulong)uVar1,1);
  (*local_48.super_IOStream._vptr_IOStream[3])(&local_48,&cam->mPosition,4,1);
  (*local_48.super_IOStream._vptr_IOStream[3])(&local_48,&(cam->mPosition).y,4,1);
  (*local_48.super_IOStream._vptr_IOStream[3])(&local_48,&(cam->mPosition).z,4,1);
  (*local_48.super_IOStream._vptr_IOStream[3])(&local_48,&cam->mLookAt,4,1);
  (*local_48.super_IOStream._vptr_IOStream[3])(&local_48,&(cam->mLookAt).y,4,1);
  (*local_48.super_IOStream._vptr_IOStream[3])(&local_48,&(cam->mLookAt).z,4,1);
  (*local_48.super_IOStream._vptr_IOStream[3])(&local_48,&cam->mUp,4,1);
  (*local_48.super_IOStream._vptr_IOStream[3])(&local_48,&(cam->mUp).y,4,1);
  (*local_48.super_IOStream._vptr_IOStream[3])(&local_48,&(cam->mUp).z,4,1);
  (*local_48.super_IOStream._vptr_IOStream[3])(&local_48,&cam->mHorizontalFOV,4,1);
  (*local_48.super_IOStream._vptr_IOStream[3])(&local_48,&cam->mClipPlaneNear,4,1);
  (*local_48.super_IOStream._vptr_IOStream[3])(&local_48,&cam->mClipPlaneFar,4,1);
  (*local_48.super_IOStream._vptr_IOStream[3])(&local_48,&cam->mAspect,4,1);
  AssbinChunkWriter::~AssbinChunkWriter(&local_48);
  return;
}

Assistant:

void WriteBinaryCamera( IOStream * container, const aiCamera* cam )
    {
        AssbinChunkWriter chunk( container, ASSBIN_CHUNK_AICAMERA );

        Write<aiString>(&chunk,cam->mName);
        Write<aiVector3D>(&chunk,cam->mPosition);
        Write<aiVector3D>(&chunk,cam->mLookAt);
        Write<aiVector3D>(&chunk,cam->mUp);
        Write<float>(&chunk,cam->mHorizontalFOV);
        Write<float>(&chunk,cam->mClipPlaneNear);
        Write<float>(&chunk,cam->mClipPlaneFar);
        Write<float>(&chunk,cam->mAspect);
    }